

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O0

bool __thiscall mcsFile::ProcessNextLine(mcsFile *this,RecInfo *rec)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  void *pvVar4;
  byte local_81;
  uint local_80;
  byte local_7a;
  uchar cksum;
  uint i;
  uchar addr_low;
  uchar addr_high;
  unsigned_long csum_computed;
  char local_68 [4];
  int nbytes;
  char buffer [64];
  int MCS_LINE_MAX;
  RecInfo *rec_local;
  mcsFile *this_local;
  
  buffer[0x3c] = '@';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  std::istream::getline((char *)this,(long)local_68);
  this->line_num = this->line_num + 1;
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) == 0) {
    if (local_68[0] == ':') {
      csum_computed._4_4_ = std::istream::gcount();
      if (csum_computed._4_4_ < 0x40) {
        if (local_68[csum_computed._4_4_ + -1] == '\0') {
          csum_computed._4_4_ = csum_computed._4_4_ + -1;
        }
        _i = 0;
        bVar1 = toHex(this,local_68 + 1,&rec->ndata);
        if (bVar1) {
          _i = rec->ndata + _i;
          if (rec->ndata < 0x11) {
            bVar1 = toHex(this,local_68 + 3,&cksum);
            if (bVar1) {
              _i = cksum + _i;
              bVar1 = toHex(this,(char *)((long)&nbytes + 1),&local_7a);
              if (bVar1) {
                _i = local_7a + _i;
                rec->addr = (ushort)cksum * 0x100 + (ushort)local_7a;
                bVar1 = toHex(this,(char *)((long)&nbytes + 3),&rec->type);
                if (bVar1) {
                  _i = rec->type + _i;
                  for (local_80 = 0; local_80 < rec->ndata; local_80 = local_80 + 1) {
                    bVar1 = toHex(this,buffer + (ulong)(local_80 << 1) + 1,rec->data + local_80);
                    if (!bVar1) {
                      return false;
                    }
                    _i = rec->data[local_80] + _i;
                  }
                  bVar1 = toHex(this,buffer + (long)(int)((uint)rec->ndata << 1) + 1,&local_81);
                  if (bVar1) {
                    _i = local_81 + _i & 0xff;
                    if (_i == 0) {
                      this_local._7_1_ = true;
                    }
                    else {
                      poVar3 = std::operator<<((ostream *)&std::cerr,"ProcessNextLine: line ");
                      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
                      poVar3 = std::operator<<(poVar3," checksum error = ");
                      pvVar4 = (void *)std::ostream::operator<<(poVar3,_i);
                      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"ProcessNextLine: line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
            poVar3 = std::operator<<(poVar3," has too much data, num bytes = ");
            poVar3 = std::operator<<(poVar3,rec->ndata);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"ProcessNextLine: line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
        poVar3 = std::operator<<(poVar3," has too many characters, nbytes = ");
        pvVar4 = (void *)std::ostream::operator<<(poVar3,csum_computed._4_4_);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mcsFile::ProcessNextLine(RecInfo &rec)
{
    // MCS file generated by ISE has line lengths no larger than 43 bytes
    const int MCS_LINE_MAX = 64;
    char buffer[MCS_LINE_MAX];

    file.getline(buffer, sizeof(buffer));
    line_num++;
    if (file.eof()) return false;

    if (buffer[0] != ':') return false;
    int nbytes = static_cast<int>(file.gcount());
    if (nbytes >= MCS_LINE_MAX) {
        // If this error occurs, increase MCS_LINE_MAX
        std::cerr << "ProcessNextLine: line " << line_num
                  << " has too many characters, nbytes = " << nbytes << std::endl;
        return false;
    }
    if (!buffer[nbytes-1]) nbytes--;

    unsigned long csum_computed = 0L;
    if (!toHex(buffer+1, rec.ndata)) return false;
    csum_computed += rec.ndata;
    if (rec.ndata > sizeof(rec.data)) {
        // If this error occurs, increase RecInfo::DATA_MAX
        std::cerr << "ProcessNextLine: line " << line_num
                  << " has too much data, num bytes = " << rec.ndata << std::endl;
        return false;
    }
    unsigned char addr_high, addr_low;
    if (!toHex(buffer+3, addr_high)) return false;
    csum_computed += addr_high;
    if (!toHex(buffer+5, addr_low)) return false;
    csum_computed += addr_low;
    rec.addr = (addr_high<<8)+addr_low;
    if (!toHex(buffer+7, rec.type)) return false;
    csum_computed += rec.type;

    // convert to binary and compute checksum
    for (unsigned int i = 0; i < rec.ndata; i++) {
        if (!toHex(buffer+9+2*i, rec.data[i])) return false;
        csum_computed += rec.data[i];
    }
    unsigned char cksum;
    if (!toHex(buffer+9+2*rec.ndata, cksum)) return false;
    csum_computed += cksum;
    
    csum_computed &= 0x000000ff;
    if (csum_computed) {
        std::cerr << "ProcessNextLine: line " << line_num
                  << " checksum error = " << csum_computed << std::endl;
        return false;
    }
    return true;
}